

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackagePython.cpp
# Opt level: O1

PyObject * PyInit_libmodelpackage(void)

{
  int iVar1;
  char *__s1;
  class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *pcVar2;
  class_<MPL::ModelPackage> *pcVar3;
  module m;
  handle hStack_88;
  handle local_80;
  handle local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  
  __s1 = (char *)Py_GetVersion();
  iVar1 = strncmp(__s1,"3.10",4);
  if ((iVar1 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::module_
              ((module_ *)&local_80,"libmodelpackage",
               "Library to create, access and edit model packages");
    pybind11::class_<MPL::ModelPackageItemInfo,_std::shared_ptr<MPL::ModelPackageItemInfo>_>::
    class_<>((class_<MPL::ModelPackageItemInfo,_std::shared_ptr<MPL::ModelPackageItemInfo>_> *)
             &local_78,local_80,"ModelPackageItemInfo");
    local_58 = MPL::ModelPackageItemInfo::identifier_abi_cxx11_;
    local_50 = 0;
    pcVar2 = (class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *)
             pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>
             ::def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
                       ((class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>
                         *)&local_78,"identifier",
                        (offset_in_ModelPackageItemInfo_to_subr *)&local_58);
    local_68 = MPL::ModelPackageItemInfo::path_abi_cxx11_;
    local_60 = 0;
    pcVar2 = (class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *)
             pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>
             ::def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
                       (pcVar2,"path",(offset_in_ModelPackageItemInfo_to_subr *)&local_68);
    local_20 = MPL::ModelPackageItemInfo::name_abi_cxx11_;
    local_18 = 0;
    pcVar2 = (class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *)
             pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>
             ::def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
                       (pcVar2,"name",(offset_in_ModelPackageItemInfo_to_subr *)&local_20);
    local_30 = MPL::ModelPackageItemInfo::author_abi_cxx11_;
    local_28 = 0;
    pcVar2 = (class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *)
             pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>
             ::def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
                       (pcVar2,"author",(offset_in_ModelPackageItemInfo_to_subr *)&local_30);
    local_40 = MPL::ModelPackageItemInfo::description_abi_cxx11_;
    local_38 = 0;
    pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>::
    def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
              (pcVar2,"description",(offset_in_ModelPackageItemInfo_to_subr *)&local_40);
    pybind11::handle::dec_ref(&local_78);
    pybind11::class_<MPL::ModelPackage>::class_<>
              ((class_<MPL::ModelPackage> *)&hStack_88,local_80,"ModelPackage");
    pybind11::class_<MPL::ModelPackage>::
    def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_apple[P]coremltools_deps_pybind11_include_pybind11_detail_init_h:205:13),_pybind11::detail::is_new_style_constructor>
              ((class_<MPL::ModelPackage> *)&hStack_88,"__init__",(type *)&local_58,
               (is_new_style_constructor *)&local_68);
    local_58 = MPL::ModelPackage::path_abi_cxx11_;
    local_50 = 0;
    pcVar3 = pybind11::class_<MPL::ModelPackage>::
             def<std::__cxx11::string(MPL::ModelPackage::*)()const>
                       ((class_<MPL::ModelPackage> *)&hStack_88,"path",
                        (offset_in_ModelPackageItemInfo_to_subr *)&local_58);
    local_68 = MPL::ModelPackage::setRootModel;
    local_60 = 0;
    pcVar3 = pybind11::class_<MPL::ModelPackage>::
             def<std::__cxx11::string(MPL::ModelPackage::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                       (pcVar3,"setRootModel",(offset_in_ModelPackage_to_subr *)&local_68);
    local_20 = MPL::ModelPackage::replaceRootModel;
    local_18 = 0;
    pcVar3 = pybind11::class_<MPL::ModelPackage>::
             def<std::__cxx11::string(MPL::ModelPackage::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                       (pcVar3,"replaceRootModel",(offset_in_ModelPackage_to_subr *)&local_20);
    local_30 = MPL::ModelPackage::addItem;
    local_28 = 0;
    pcVar3 = pybind11::class_<MPL::ModelPackage>::
             def<std::__cxx11::string(MPL::ModelPackage::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                       (pcVar3,"addItem",(offset_in_ModelPackage_to_subr *)&local_30);
    local_40 = MPL::ModelPackage::getRootModel;
    local_38 = 0;
    pcVar3 = pybind11::class_<MPL::ModelPackage>::
             def<std::shared_ptr<MPL::ModelPackageItemInfo>(MPL::ModelPackage::*)()const>
                       (pcVar3,"getRootModel",(offset_in_ModelPackageItemInfo_to_subr *)&local_40);
    local_48 = MPL::ModelPackage::isValid;
    pcVar3 = pybind11::class_<MPL::ModelPackage>::def<bool(*)(std::__cxx11::string_const&)>
                       (pcVar3,"isValid",&local_48);
    local_78.m_ptr = (PyObject *)MPL::ModelPackage::findItem;
    local_70 = 0;
    pybind11::class_<MPL::ModelPackage>::
    def<std::shared_ptr<MPL::ModelPackageItemInfo>(MPL::ModelPackage::*)(std::__cxx11::string_const&,std::__cxx11::string_const&)const>
              (pcVar3,"findItemByNameAuthor",(offset_in_ModelPackageItemInfo_to_subr *)&local_78);
    pybind11::handle::dec_ref(&hStack_88);
    pybind11::handle::dec_ref(&local_80);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    local_80.m_ptr = (PyObject *)0x0;
  }
  return local_80.m_ptr;
}

Assistant:

PYBIND11_PLUGIN(libmodelpackage) {
    py::module m("libmodelpackage", "Library to create, access and edit model packages");
    
    py::class_<MPL::ModelPackageItemInfo, std::shared_ptr<MPL::ModelPackageItemInfo>>(m, "ModelPackageItemInfo")
        .def("identifier", &MPL::ModelPackageItemInfo::identifier)
        .def("path", &MPL::ModelPackageItemInfo::path)
        .def("name", &MPL::ModelPackageItemInfo::name)
        .def("author", &MPL::ModelPackageItemInfo::author)
        .def("description", &MPL::ModelPackageItemInfo::description);
    
    py::class_<MPL::ModelPackage>(m, "ModelPackage")
        .def(py::init<const std::string&>())
        .def("path", &MPL::ModelPackage::path)
        .def("setRootModel", &MPL::ModelPackage::setRootModel)
        .def("replaceRootModel", &MPL::ModelPackage::replaceRootModel)
        .def("addItem", &MPL::ModelPackage::addItem)
        .def("getRootModel", &MPL::ModelPackage::getRootModel)
        .def("isValid", &MPL::ModelPackage::isValid)
        .def("findItemByNameAuthor", py::overload_cast<const std::string&, const std::string&>(&MPL::ModelPackage::findItem, py::const_));
    
    return m.ptr();
}